

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

void xmlRegisterDefaultInputCallbacks(void)

{
  if (xmlInputCallbackInitialized == 0) {
    xmlRegisterInputCallbacks(xmlFileMatch,xmlFileOpen,xmlFileRead,xmlFileClose);
    xmlRegisterInputCallbacks(xmlGzfileMatch,xmlGzfileOpen,xmlGzfileRead,xmlGzfileClose);
    xmlRegisterInputCallbacks(xmlXzfileMatch,xmlXzfileOpen,xmlXzfileRead,xmlXzfileClose);
    xmlRegisterInputCallbacks(xmlIOHTTPMatch,xmlIOHTTPOpen,xmlIOHTTPRead,xmlIOHTTPClose);
    xmlInputCallbackInitialized = 1;
  }
  return;
}

Assistant:

void
xmlRegisterDefaultInputCallbacks(void) {
    if (xmlInputCallbackInitialized)
	return;

    xmlRegisterInputCallbacks(xmlFileMatch, xmlFileOpen,
	                      xmlFileRead, xmlFileClose);
#ifdef LIBXML_ZLIB_ENABLED
    xmlRegisterInputCallbacks(xmlGzfileMatch, xmlGzfileOpen,
	                      xmlGzfileRead, xmlGzfileClose);
#endif /* LIBXML_ZLIB_ENABLED */
#ifdef LIBXML_LZMA_ENABLED
    xmlRegisterInputCallbacks(xmlXzfileMatch, xmlXzfileOpen,
	                      xmlXzfileRead, xmlXzfileClose);
#endif /* LIBXML_LZMA_ENABLED */

#ifdef LIBXML_HTTP_ENABLED
    xmlRegisterInputCallbacks(xmlIOHTTPMatch, xmlIOHTTPOpen,
	                      xmlIOHTTPRead, xmlIOHTTPClose);
#endif /* LIBXML_HTTP_ENABLED */

#ifdef LIBXML_FTP_ENABLED
    xmlRegisterInputCallbacks(xmlIOFTPMatch, xmlIOFTPOpen,
	                      xmlIOFTPRead, xmlIOFTPClose);
#endif /* LIBXML_FTP_ENABLED */
    xmlInputCallbackInitialized = 1;
}